

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::recreateLayout(QWizardPrivate *this,QWizardLayoutInfo *info)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  WizardStyle WVar9;
  QLatin1StringView latin1;
  int iVar10;
  uint uVar11;
  QWidget *pQVar12;
  long *plVar13;
  long lVar14;
  QObject *pQVar15;
  QWizardHeader *pQVar16;
  QLabel *pQVar17;
  QFont *pQVar18;
  QPalette *pQVar19;
  QWatermarkLabel *pQVar20;
  QWizardRuler *pQVar21;
  int *in_RSI;
  QWizardPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  int buttonNumColumns;
  int buttonStartColumn;
  int watermarkEndRow;
  bool baseBackground;
  bool wasSemiTransparent;
  int bottomMargin;
  int rightMargin;
  int topMargin;
  int leftMargin;
  int vMargin;
  int hMargin;
  int aeroTitleIndent;
  int watermarkStartRow;
  int pageColumn;
  int numColumns;
  int row;
  int deltaVSpacing;
  int deltaMarginBottom;
  int deltaMarginTop;
  int deltaMarginRight;
  int deltaMarginLeft;
  bool aero;
  bool modern;
  bool classic;
  bool mac;
  int i_2;
  int i_1;
  QLayoutItem *item;
  int i;
  QWizard *q;
  QPalette pal_1;
  QPalette pal;
  QFont titleFont;
  Policy in_stack_fffffffffffffc48;
  Policy in_stack_fffffffffffffc4c;
  QWidget *in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  byte bVar26;
  QWidget *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffc6c;
  QWidget *in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc78;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffffc7c;
  int in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  int iVar27;
  int in_stack_fffffffffffffc88;
  undefined4 uVar28;
  int in_stack_fffffffffffffc8c;
  undefined4 uVar29;
  undefined4 in_stack_fffffffffffffc90;
  int iVar30;
  undefined4 in_stack_fffffffffffffc94;
  QGridLayout *in_stack_fffffffffffffc98;
  QGridLayout *pQVar31;
  QHBoxLayout *pQVar32;
  undefined4 in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb8;
  QFlagsStorage<Qt::AlignmentFlag> QVar33;
  int local_31c;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  QWizardHeader *in_stack_fffffffffffffd08;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffffd2c;
  QFlagsStorage<Qt::AlignmentFlag> QVar34;
  int local_1b0;
  int local_170;
  int local_16c;
  int local_150;
  int local_14c;
  int local_13c;
  undefined1 local_120 [4];
  undefined1 local_11c [4];
  undefined1 local_118 [4];
  undefined1 local_114 [4];
  QBrush local_110 [8];
  QBrush local_108 [12];
  undefined1 local_fc [4];
  undefined1 local_f8 [4];
  undefined1 local_f4 [4];
  undefined1 local_f0 [4];
  undefined1 local_ec [4];
  undefined1 local_e8 [4];
  undefined1 local_e4 [4];
  undefined1 local_e0 [24];
  undefined1 local_c8 [4];
  Policy local_c4 [9];
  int local_a0 [2];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  QPalette local_68 [2];
  undefined1 local_48 [16];
  QFont local_38 [16];
  QPalette local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = (QWidget *)q_func(in_RDI);
  local_13c = (**(code **)(*(long *)&in_RDI->mainLayout->super_QLayout + 200))();
  while (local_13c = local_13c + -1, -1 < local_13c) {
    plVar13 = (long *)(**(code **)(*(long *)&in_RDI->mainLayout->super_QLayout + 0xb0))
                                (in_RDI->mainLayout,local_13c);
    lVar14 = (**(code **)(*plVar13 + 0x70))();
    if (lVar14 == 0) {
      if (plVar13 != (long *)0x0) {
        (**(code **)(*plVar13 + 8))();
      }
    }
    else {
      pQVar15 = (QObject *)(**(code **)(*plVar13 + 0x70))();
      QObject::setParent(pQVar15);
    }
  }
  local_14c = QGridLayout::columnCount((QGridLayout *)in_stack_fffffffffffffc50);
  while (local_14c = local_14c + -1, -1 < local_14c) {
    QGridLayout::setColumnMinimumWidth
              ((QGridLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58);
  }
  local_150 = QGridLayout::rowCount((QGridLayout *)in_stack_fffffffffffffc50);
  while( true ) {
    QVar33.i = (Int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
    local_150 = local_150 + -1;
    if (local_150 < 0) break;
    QGridLayout::setRowMinimumHeight
              ((QGridLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58);
  }
  bVar22 = in_RSI[0xb] == 2;
  bVar23 = in_RSI[0xb] == 0;
  bVar24 = in_RSI[0xb] == 1;
  bVar25 = in_RSI[0xb] == 3;
  local_16c = 0;
  if (bVar22) {
    local_170 = 3;
  }
  else if (((*(byte *)((long)in_RSI + 0x31) & 1) == 0) &&
          ((*(byte *)((long)in_RSI + 0x35) & 1) == 0)) {
    local_170 = 1;
  }
  else {
    local_170 = 2;
  }
  local_a0[1] = 1;
  local_a0[0] = local_170 + -1;
  qMin<int>(local_a0 + 1,local_a0);
  if (bVar22) {
    QMargins::QMargins((QMargins *)in_stack_fffffffffffffc50);
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,
               (QMargins *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    (**(code **)(*(long *)&in_RDI->mainLayout->super_QLayout + 0x68))(in_RDI->mainLayout,0);
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
               (int)in_stack_fffffffffffffc50);
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
               (int)in_stack_fffffffffffffc50);
  }
  else if (bVar24) {
    QMargins::QMargins((QMargins *)in_stack_fffffffffffffc50);
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,
               (QMargins *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    (**(code **)(*(long *)&in_RDI->mainLayout->super_QLayout + 0x68))(in_RDI->mainLayout,0);
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
               (int)in_stack_fffffffffffffc50);
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
               (int)in_stack_fffffffffffffc50);
  }
  else {
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
               (int)in_stack_fffffffffffffc50);
    QGridLayout::setHorizontalSpacing
              ((QGridLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    QGridLayout::setVerticalSpacing
              ((QGridLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
               (int)in_stack_fffffffffffffc50);
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
               (int)in_stack_fffffffffffffc50);
  }
  (**(code **)(*(long *)&(in_RDI->buttonLayout->super_QBoxLayout).super_QLayout + 0x68))();
  if ((*(byte *)(in_RSI + 0xc) & 1) != 0) {
    if (in_RDI->headerWidget == (QWizardHeader *)0x0) {
      pQVar16 = (QWizardHeader *)operator_new(0x60);
      QWizardHeader::QWizardHeader
                (in_stack_fffffffffffffd08,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      in_RDI->headerWidget = pQVar16;
    }
    QWidget::setAutoFillBackground
              (in_stack_fffffffffffffc60,SUB41((uint)in_stack_fffffffffffffc5c >> 0x18,0));
    local_16c = 1;
    memset(local_c4,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b7acf);
    QGridLayout::addWidget
              ((QGridLayout *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (QWidget *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc84,in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c.i,
               in_stack_fffffffffffffc78,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffc98 >> 0x20,0));
    in_stack_fffffffffffffc48 = local_c4[0];
  }
  iVar30 = local_16c;
  if (in_RDI->headerWidget != (QWizardHeader *)0x0) {
    (**(code **)(*(long *)&in_RDI->headerWidget->super_QWidget + 0x68))();
  }
  if (bVar22) {
    local_16c = local_16c + 1;
    QGridLayout::setRowMinimumHeight
              ((QGridLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58);
  }
  if ((*(byte *)((long)in_RSI + 0x32) & 1) != 0) {
    if (in_RDI->titleLabel == (QLabel *)0x0) {
      pQVar17 = (QLabel *)operator_new(0x28);
      memset(local_c8,0,4);
      QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7b7bf6);
      QLabel::QLabel((QLabel *)in_stack_fffffffffffffc60,
                     (QWidget *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     (WindowFlags)in_stack_fffffffffffffc6c.i);
      in_RDI->titleLabel = pQVar17;
      QWidget::setBackgroundRole(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      QLabel::setWordWrap((QLabel *)in_stack_fffffffffffffc50,
                          SUB41(in_stack_fffffffffffffc4c >> 0x18,0));
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar18 = QWidget::font(pQVar12);
    QFont::QFont((QFont *)&local_18,pQVar18);
    QFont::pointSize();
    QFont::setPointSize((int)&local_18);
    QFont::setBold((QFont *)in_stack_fffffffffffffc50,SUB41(in_stack_fffffffffffffc4c >> 0x18,0));
    QPalette::QPalette(&local_28);
    QWidget::setPalette((QWidget *)CONCAT44(in_stack_fffffffffffffc6c.i,in_stack_fffffffffffffc68),
                        (QPalette *)in_stack_fffffffffffffc60);
    QPalette::~QPalette(&local_28);
    if (bVar25) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 (size_t)in_stack_fffffffffffffc50);
      latin1.m_size._4_4_ = in_stack_fffffffffffffc84;
      latin1.m_size._0_4_ = in_stack_fffffffffffffc80;
      latin1.m_data._0_4_ = in_stack_fffffffffffffc88;
      latin1.m_data._4_4_ = in_stack_fffffffffffffc8c;
      QString::QString((QString *)in_stack_fffffffffffffc60,latin1);
      QFont::QFont(local_38,(QString *)local_e0,0xc,-1,false);
      QFont::operator=((QFont *)in_stack_fffffffffffffc50,
                       (QFont *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      QFont::~QFont(local_38);
      QString::~QString((QString *)0x7b7db8);
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar19 = QWidget::palette(in_stack_fffffffffffffc50);
      QPalette::QPalette((QPalette *)local_48,(QPalette *)pQVar19);
      QColor::QColor((QColor *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     in_stack_fffffffffffffc7c.i,in_stack_fffffffffffffc78,
                     (int)((ulong)in_stack_fffffffffffffc70 >> 0x20),(int)in_stack_fffffffffffffc70)
      ;
      QPalette::setColor((QPalette *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                         (QColor *)0x7b7e33);
      QWidget::setPalette((QWidget *)CONCAT44(in_stack_fffffffffffffc6c.i,in_stack_fffffffffffffc68)
                          ,(QPalette *)in_stack_fffffffffffffc60);
      QPalette::~QPalette((QPalette *)local_48);
    }
    QWidget::setFont((QWidget *)CONCAT44(in_stack_fffffffffffffc7c.i,in_stack_fffffffffffffc78),
                     (QFont *)in_stack_fffffffffffffc70);
    if (bVar25) {
      QLabel::setIndent((QLabel *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    }
    else if (bVar22) {
      QLabel::setIndent((QLabel *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    }
    else if (bVar23) {
      QLabel::setIndent((QLabel *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    }
    else {
      QLabel::setIndent((QLabel *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    }
    if (bVar24) {
      if (in_RDI->placeholderWidget1 == (QWidget *)0x0) {
        pQVar12 = (QWidget *)operator_new(0x28);
        memset(local_e4,0,4);
        QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7b7f8b);
        QWidget::QWidget(in_stack_fffffffffffffc60,
                         (QWidget *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                         (WindowFlags)in_stack_fffffffffffffc6c.i);
        in_RDI->placeholderWidget1 = pQVar12;
        QWidget::setBackgroundRole(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      }
      QWidget::setFixedHeight
                ((QWidget *)CONCAT44(in_stack_fffffffffffffc6c.i,in_stack_fffffffffffffc68),
                 (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
      local_16c = local_16c + 1;
      memset(local_e8,0,4);
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b805d);
      QGridLayout::addWidget
                (in_stack_fffffffffffffc98,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88,
                 (Alignment)in_stack_fffffffffffffd2c.i);
    }
    memset(local_ec,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b80f5);
    QGridLayout::addWidget
              (in_stack_fffffffffffffc98,
               (QWidget *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88,
               (Alignment)in_stack_fffffffffffffd2c.i);
    iVar10 = local_16c + 1;
    if (bVar24) {
      if (in_RDI->placeholderWidget2 == (QWidget *)0x0) {
        pQVar12 = (QWidget *)operator_new(0x28);
        memset(local_f0,0,4);
        QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7b8191);
        QWidget::QWidget(in_stack_fffffffffffffc60,
                         (QWidget *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                         (WindowFlags)in_stack_fffffffffffffc6c.i);
        in_RDI->placeholderWidget2 = pQVar12;
        QWidget::setBackgroundRole(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      }
      QWidget::setFixedHeight
                ((QWidget *)CONCAT44(in_stack_fffffffffffffc6c.i,in_stack_fffffffffffffc68),
                 (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
      memset(local_f4,0,4);
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b825b);
      QGridLayout::addWidget
                (in_stack_fffffffffffffc98,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88,
                 (Alignment)in_stack_fffffffffffffd2c.i);
      iVar10 = local_16c + 2;
    }
    local_16c = iVar10;
    if (bVar22) {
      local_16c = local_16c + 1;
      QGridLayout::setRowMinimumHeight
                ((QGridLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                 in_stack_fffffffffffffc58);
    }
    QFont::~QFont((QFont *)&local_18);
  }
  if (in_RDI->placeholderWidget1 != (QWidget *)0x0) {
    (**(code **)(*(long *)in_RDI->placeholderWidget1 + 0x68))();
  }
  if (in_RDI->placeholderWidget2 != (QWidget *)0x0) {
    (**(code **)(*(long *)in_RDI->placeholderWidget2 + 0x68))();
  }
  if (((*(byte *)((long)in_RSI + 0x33) & 1) != 0) && (in_RDI->subTitleLabel == (QLabel *)0x0)) {
    pQVar17 = (QLabel *)operator_new(0x28);
    memset(local_f8,0,4);
    QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7b8416);
    QLabel::QLabel((QLabel *)in_stack_fffffffffffffc60,
                   (QWidget *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                   (WindowFlags)in_stack_fffffffffffffc6c.i);
    in_RDI->subTitleLabel = pQVar17;
    QLabel::setWordWrap((QLabel *)in_stack_fffffffffffffc50,
                        SUB41(in_stack_fffffffffffffc4c >> 0x18,0));
    QWidget::setContentsMargins
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58,
               (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),(int)in_stack_fffffffffffffc50);
    memset(local_fc,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b84d1);
    QBoxLayout::insertWidget
              ((QBoxLayout *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc8c,
               (QWidget *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc7c.i,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffc98 >> 0x20,0));
  }
  changeSpacerSize((QLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
                   in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
  QVar34.i = CONCAT13(bVar22,(int3)in_stack_fffffffffffffd2c.i);
  ::operator|((Shape)((ulong)in_stack_fffffffffffffc50 >> 0x20),(Shadow)in_stack_fffffffffffffc50);
  QFrame::setFrameStyle((QFrame *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  QFrame::setLineWidth((QFrame *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
  QFrame::setMidLineWidth((QFrame *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
  iVar10 = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
  if (bVar25) {
    QWidget::setContentsMargins
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58,iVar10,
               (int)in_stack_fffffffffffffc50);
  }
  else {
    QWidget::setContentsMargins
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58,iVar10,
               (int)in_stack_fffffffffffffc50);
  }
  if ((((*(byte *)((long)in_RSI + 0x31) & 1) != 0) || ((*(byte *)((long)in_RSI + 0x35) & 1) != 0))
     && (in_RDI->watermarkLabel == (QWatermarkLabel *)0x0)) {
    pQVar20 = (QWatermarkLabel *)operator_new(0x38);
    QWatermarkLabel::QWatermarkLabel
              ((QWatermarkLabel *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               (QWidget *)CONCAT44(in_stack_fffffffffffffc7c.i,in_stack_fffffffffffffc78),
               in_stack_fffffffffffffc70);
    in_RDI->watermarkLabel = pQVar20;
    QWidget::setBackgroundRole(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    QWidget::setMinimumHeight(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    QWidget::setSizePolicy
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
    Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                  (enum_type)in_stack_fffffffffffffc50);
    QLabel::setAlignment((QLabel *)in_stack_fffffffffffffc60,(Alignment)in_stack_fffffffffffffc7c.i)
    ;
  }
  QWidget::palette(in_stack_fffffffffffffc50);
  QPalette::brush((QPalette *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
  QBrush::color((QBrush *)0x7b8831);
  iVar10 = QColor::alpha();
  bVar1 = true;
  if (0xfe < iVar10) {
    QWidget::palette(in_stack_fffffffffffffc50);
    QPalette::brush((QPalette *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    QBrush::color((QBrush *)0x7b8875);
    iVar10 = QColor::alpha();
    bVar1 = iVar10 < 0xff;
  }
  if (bVar22) {
    QWidget::setAutoFillBackground
              (in_stack_fffffffffffffc60,SUB41((uint)in_stack_fffffffffffffc5c >> 0x18,0));
    QWidget::setAutoFillBackground
              (in_stack_fffffffffffffc60,SUB41((uint)in_stack_fffffffffffffc5c >> 0x18,0));
  }
  else {
    if (bVar1) {
      QPalette::QPalette(local_68);
      QWidget::setPalette((QWidget *)CONCAT44(in_stack_fffffffffffffc6c.i,in_stack_fffffffffffffc68)
                          ,(QPalette *)in_stack_fffffffffffffc60);
      QPalette::~QPalette(local_68);
    }
    QWidget::setBackgroundRole(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    if (in_RDI->titleLabel != (QLabel *)0x0) {
      QWidget::setAutoFillBackground
                (in_stack_fffffffffffffc60,SUB41((uint)in_stack_fffffffffffffc5c >> 0x18,0));
    }
    QWidget::setAutoFillBackground
              (in_stack_fffffffffffffc60,SUB41((uint)in_stack_fffffffffffffc5c >> 0x18,0));
    if (in_RDI->watermarkLabel != (QWatermarkLabel *)0x0) {
      QWidget::setAutoFillBackground
                (in_stack_fffffffffffffc60,SUB41((uint)in_stack_fffffffffffffc5c >> 0x18,0));
    }
    if (in_RDI->placeholderWidget1 != (QWidget *)0x0) {
      QWidget::setAutoFillBackground
                (in_stack_fffffffffffffc60,SUB41((uint)in_stack_fffffffffffffc5c >> 0x18,0));
    }
    if (in_RDI->placeholderWidget2 != (QWidget *)0x0) {
      QWidget::setAutoFillBackground
                (in_stack_fffffffffffffc60,SUB41((uint)in_stack_fffffffffffffc5c >> 0x18,0));
    }
    if (bVar25) {
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar19 = QWidget::palette(in_stack_fffffffffffffc50);
      QPalette::QPalette((QPalette *)local_78,(QPalette *)pQVar19);
      QColor::QColor((QColor *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     in_stack_fffffffffffffc7c.i,in_stack_fffffffffffffc78,
                     (int)((ulong)in_stack_fffffffffffffc70 >> 0x20),(int)in_stack_fffffffffffffc70)
      ;
      QBrush::QBrush(local_108,(QColor *)local_88,SolidPattern);
      QPalette::setBrush((QPalette *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                         (QBrush *)0x7b8b15);
      QBrush::~QBrush(local_108);
      QWidget::setPalette((QWidget *)CONCAT44(in_stack_fffffffffffffc6c.i,in_stack_fffffffffffffc68)
                          ,(QPalette *)in_stack_fffffffffffffc60);
      QWidget::setAutoFillBackground
                (in_stack_fffffffffffffc60,SUB41((uint)in_stack_fffffffffffffc5c >> 0x18,0));
      pQVar19 = QWidget::palette(in_stack_fffffffffffffc50);
      QPalette::operator=((QPalette *)local_78,(QPalette *)pQVar19);
      QColor::QColor((QColor *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     in_stack_fffffffffffffc7c.i,in_stack_fffffffffffffc78,
                     (int)((ulong)in_stack_fffffffffffffc70 >> 0x20),(int)in_stack_fffffffffffffc70)
      ;
      QBrush::QBrush(local_110,(QColor *)local_98,SolidPattern);
      QPalette::setBrush((QPalette *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                         (QBrush *)0x7b8bcb);
      QBrush::~QBrush(local_110);
      QWidget::setPalette((QWidget *)CONCAT44(in_stack_fffffffffffffc6c.i,in_stack_fffffffffffffc68)
                          ,(QPalette *)in_stack_fffffffffffffc60);
      QWidget::setAutoFillBackground
                (in_stack_fffffffffffffc60,SUB41((uint)in_stack_fffffffffffffc5c >> 0x18,0));
      QPalette::~QPalette((QPalette *)local_78);
    }
  }
  local_1b0 = local_16c + 1;
  memset(local_114,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b8c89);
  QGridLayout::addWidget
            (in_stack_fffffffffffffc98,
             (QWidget *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88,(Alignment)QVar34.i);
  QVar34.i = (Int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  iVar10 = local_1b0;
  if (bVar23) {
    QGridLayout::setRowMinimumHeight
              ((QGridLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58);
    iVar10 = local_16c + 2;
  }
  local_16c = iVar10;
  if (bVar25) {
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
               (int)in_stack_fffffffffffffc50);
    QLayout::setContentsMargins
              ((QLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
               (int)in_stack_fffffffffffffc50);
  }
  uVar11 = (uint)((*(byte *)(in_RSI + 0xd) & 1) != 0);
  if ((*(byte *)(in_RSI + 0xd) & 1) == 0) {
    local_31c = local_170;
  }
  else {
    local_31c = 1;
  }
  if ((bVar23) || (bVar24)) {
    if (in_RDI->bottomRuler == (QWizardRuler *)0x0) {
      pQVar21 = (QWizardRuler *)operator_new(0x60);
      QWizardRuler::QWizardRuler
                ((QWizardRuler *)in_stack_fffffffffffffc50,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      in_RDI->bottomRuler = pQVar21;
    }
    QVar33.i = (Int)((ulong)in_RDI->mainLayout >> 0x20);
    local_16c = local_16c + 1;
    memset(local_118,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b8e7f);
    QGridLayout::addWidget
              ((QGridLayout *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (QWidget *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc84,in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c.i,
               in_stack_fffffffffffffc78,(Alignment)QVar34.i);
  }
  if (bVar23) {
    local_16c = local_16c + 1;
    QGridLayout::setRowMinimumHeight
              ((QGridLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58);
  }
  pQVar31 = in_RDI->mainLayout;
  pQVar32 = in_RDI->buttonLayout;
  iVar10 = local_16c + 1;
  memset(local_11c,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b8f58);
  QGridLayout::addLayout
            ((QGridLayout *)CONCAT44(local_31c,uVar11),
             (QLayout *)CONCAT44(local_16c,in_stack_fffffffffffffca8),(int)((ulong)pQVar32 >> 0x20),
             (int)pQVar32,(int)((ulong)pQVar31 >> 0x20),(int)pQVar31,(Alignment)QVar33.i);
  QVar33.i = (Int)((ulong)pQVar31 >> 0x20);
  if (((*(byte *)((long)in_RSI + 0x31) & 1) != 0) || ((*(byte *)((long)in_RSI + 0x35) & 1) != 0)) {
    if ((*(byte *)(in_RSI + 0xd) & 1) != 0) {
      local_1b0 = iVar10;
    }
    iVar10 = (int)in_RDI->mainLayout;
    iVar27 = (int)((ulong)in_RDI->mainLayout >> 0x20);
    uVar28 = SUB84(in_RDI->watermarkLabel,0);
    uVar29 = (undefined4)((ulong)in_RDI->watermarkLabel >> 0x20);
    local_1b0 = local_1b0 - iVar30;
    memset(local_120,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b901e);
    QGridLayout::addWidget
              ((QGridLayout *)CONCAT44(local_1b0,iVar30),(QWidget *)CONCAT44(uVar29,uVar28),iVar27,
               iVar10,in_stack_fffffffffffffc7c.i,in_stack_fffffffffffffc78,(Alignment)QVar33.i);
  }
  QGridLayout::setColumnMinimumWidth
            ((QGridLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
             in_stack_fffffffffffffc58);
  if (bVar22) {
    QGridLayout::setColumnMinimumWidth
              ((QGridLayout *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,
               in_stack_fffffffffffffc58);
  }
  if (in_RDI->headerWidget != (QWizardHeader *)0x0) {
    (**(code **)(*(long *)&in_RDI->headerWidget->super_QWidget + 0x68))
              (in_RDI->headerWidget,*(byte *)(in_RSI + 0xc) & 1);
  }
  if (in_RDI->titleLabel != (QLabel *)0x0) {
    (**(code **)(*(long *)&(in_RDI->titleLabel->super_QFrame).super_QWidget + 0x68))
              (in_RDI->titleLabel,*(byte *)((long)in_RSI + 0x32) & 1);
  }
  if (in_RDI->subTitleLabel != (QLabel *)0x0) {
    (**(code **)(*(long *)&(in_RDI->subTitleLabel->super_QFrame).super_QWidget + 0x68))
              (in_RDI->subTitleLabel,*(byte *)((long)in_RSI + 0x33) & 1);
  }
  if (in_RDI->bottomRuler != (QWizardRuler *)0x0) {
    (**(code **)(*(long *)&(in_RDI->bottomRuler->super_QWizardHeader).super_QWidget + 0x68))
              (in_RDI->bottomRuler,bVar23 || bVar24);
  }
  if (in_RDI->watermarkLabel != (QWatermarkLabel *)0x0) {
    bVar26 = 1;
    if ((*(byte *)((long)in_RSI + 0x31) & 1) == 0) {
      bVar26 = *(byte *)((long)in_RSI + 0x35);
    }
    (**(code **)(*(long *)&(in_RDI->watermarkLabel->super_QLabel).super_QFrame.super_QWidget + 0x68)
    )(in_RDI->watermarkLabel,bVar26 & 1);
  }
  *(undefined8 *)((long)&(in_RDI->layoutInfo).wizStyle + 2) = *(undefined8 *)((long)in_RSI + 0x2e);
  iVar30 = *in_RSI;
  iVar10 = in_RSI[1];
  iVar27 = in_RSI[2];
  iVar2 = in_RSI[3];
  iVar3 = in_RSI[4];
  iVar4 = in_RSI[5];
  iVar5 = in_RSI[6];
  iVar6 = in_RSI[7];
  iVar7 = in_RSI[9];
  iVar8 = in_RSI[10];
  WVar9 = in_RSI[0xb];
  (in_RDI->layoutInfo).hspacing = in_RSI[8];
  (in_RDI->layoutInfo).vspacing = iVar7;
  (in_RDI->layoutInfo).buttonSpacing = iVar8;
  (in_RDI->layoutInfo).wizStyle = WVar9;
  (in_RDI->layoutInfo).childMarginLeft = iVar3;
  (in_RDI->layoutInfo).childMarginRight = iVar4;
  (in_RDI->layoutInfo).childMarginTop = iVar5;
  (in_RDI->layoutInfo).childMarginBottom = iVar6;
  (in_RDI->layoutInfo).topLevelMarginLeft = iVar30;
  (in_RDI->layoutInfo).topLevelMarginRight = iVar10;
  (in_RDI->layoutInfo).topLevelMarginTop = iVar27;
  (in_RDI->layoutInfo).topLevelMarginBottom = iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::recreateLayout(const QWizardLayoutInfo &info)
{
    Q_Q(QWizard);

    /*
        Start by undoing the main layout.
    */
    for (int i = mainLayout->count() - 1; i >= 0; --i) {
        QLayoutItem *item = mainLayout->takeAt(i);
        if (item->layout()) {
            item->layout()->setParent(nullptr);
        } else {
            delete item;
        }
    }
    for (int i = mainLayout->columnCount() - 1; i >= 0; --i)
        mainLayout->setColumnMinimumWidth(i, 0);
    for (int i = mainLayout->rowCount() - 1; i >= 0; --i)
        mainLayout->setRowMinimumHeight(i, 0);

    /*
        Now, recreate it.
    */

    bool mac = (info.wizStyle == QWizard::MacStyle);
    bool classic = (info.wizStyle == QWizard::ClassicStyle);
    bool modern = (info.wizStyle == QWizard::ModernStyle);
    bool aero = (info.wizStyle == QWizard::AeroStyle);
    int deltaMarginLeft = info.topLevelMarginLeft - info.childMarginLeft;
    int deltaMarginRight = info.topLevelMarginRight - info.childMarginRight;
    int deltaMarginTop = info.topLevelMarginTop - info.childMarginTop;
    int deltaMarginBottom = info.topLevelMarginBottom - info.childMarginBottom;
    int deltaVSpacing = info.topLevelMarginBottom - info.vspacing;

    int row = 0;
    int numColumns;
    if (mac) {
        numColumns = 3;
    } else if (info.watermark || info.sideWidget) {
        numColumns = 2;
    } else {
        numColumns = 1;
    }
    int pageColumn = qMin(1, numColumns - 1);

    if (mac) {
        mainLayout->setContentsMargins(QMargins());
        mainLayout->setSpacing(0);
        buttonLayout->setContentsMargins(MacLayoutLeftMargin, MacButtonTopMargin, MacLayoutRightMargin, MacLayoutBottomMargin);
        pageVBoxLayout->setContentsMargins(7, 7, 7, 7);
    } else {
        if (modern) {
            mainLayout->setContentsMargins(QMargins());
            mainLayout->setSpacing(0);
            pageVBoxLayout->setContentsMargins(deltaMarginLeft, deltaMarginTop,
                                               deltaMarginRight, deltaMarginBottom);
            buttonLayout->setContentsMargins(info.topLevelMarginLeft, info.topLevelMarginTop,
                                             info.topLevelMarginRight, info.topLevelMarginBottom);
        } else {
            mainLayout->setContentsMargins(info.topLevelMarginLeft, info.topLevelMarginTop,
                                           info.topLevelMarginRight, info.topLevelMarginBottom);
            mainLayout->setHorizontalSpacing(info.hspacing);
            mainLayout->setVerticalSpacing(info.vspacing);
            pageVBoxLayout->setContentsMargins(0, 0, 0, 0);
            buttonLayout->setContentsMargins(0, 0, 0, 0);
        }
    }
    buttonLayout->setSpacing(info.buttonSpacing);

    if (info.header) {
        if (!headerWidget)
            headerWidget = new QWizardHeader(antiFlickerWidget);
        headerWidget->setAutoFillBackground(modern);
        mainLayout->addWidget(headerWidget, row++, 0, 1, numColumns);
    }
    if (headerWidget)
        headerWidget->setVisible(info.header);

    int watermarkStartRow = row;

    if (mac)
        mainLayout->setRowMinimumHeight(row++, 10);

    if (info.title) {
        if (!titleLabel) {
            titleLabel = new QLabel(antiFlickerWidget);
            titleLabel->setBackgroundRole(QPalette::Base);
            titleLabel->setWordWrap(true);
        }

        QFont titleFont = q->font();
        titleFont.setPointSize(titleFont.pointSize() + (mac ? 3 : 4));
        titleFont.setBold(true);
        titleLabel->setPalette(QPalette());

        if (aero) {
            // ### hardcoded for now:
            titleFont = QFont("Segoe UI"_L1, 12);
            QPalette pal(titleLabel->palette());
            pal.setColor(QPalette::Text, QColor(0x00, 0x33, 0x99));
            titleLabel->setPalette(pal);
        }

        titleLabel->setFont(titleFont);
        const int aeroTitleIndent = 25; // ### hardcoded for now - should be calculated somehow
        if (aero)
            titleLabel->setIndent(aeroTitleIndent);
        else if (mac)
            titleLabel->setIndent(2);
        else if (classic)
            titleLabel->setIndent(info.childMarginLeft);
        else
            titleLabel->setIndent(info.topLevelMarginLeft);
        if (modern) {
            if (!placeholderWidget1) {
                placeholderWidget1 = new QWidget(antiFlickerWidget);
                placeholderWidget1->setBackgroundRole(QPalette::Base);
            }
            placeholderWidget1->setFixedHeight(info.topLevelMarginLeft + 2);
            mainLayout->addWidget(placeholderWidget1, row++, pageColumn);
        }
        mainLayout->addWidget(titleLabel, row++, pageColumn);
        if (modern) {
            if (!placeholderWidget2) {
                placeholderWidget2 = new QWidget(antiFlickerWidget);
                placeholderWidget2->setBackgroundRole(QPalette::Base);
            }
            placeholderWidget2->setFixedHeight(5);
            mainLayout->addWidget(placeholderWidget2, row++, pageColumn);
        }
        if (mac)
            mainLayout->setRowMinimumHeight(row++, 7);
    }
    if (placeholderWidget1)
        placeholderWidget1->setVisible(info.title && modern);
    if (placeholderWidget2)
        placeholderWidget2->setVisible(info.title && modern);

    if (info.subTitle) {
        if (!subTitleLabel) {
            subTitleLabel = new QLabel(pageFrame);
            subTitleLabel->setWordWrap(true);

            subTitleLabel->setContentsMargins(info.childMarginLeft , 0,
                                              info.childMarginRight , 0);

            pageVBoxLayout->insertWidget(1, subTitleLabel);
        }
    }

    // ### try to replace with margin.
    changeSpacerSize(pageVBoxLayout, 0, 0, info.subTitle ? info.childMarginLeft : 0);

    int hMargin = mac ? 1 : 0;
    int vMargin = hMargin;

    pageFrame->setFrameStyle(mac ? (QFrame::Box | QFrame::Raised) : QFrame::NoFrame);
    pageFrame->setLineWidth(0);
    pageFrame->setMidLineWidth(hMargin);

    if (info.header) {
        if (modern) {
            hMargin = info.topLevelMarginLeft;
            vMargin = deltaMarginBottom;
        } else if (classic) {
            hMargin = deltaMarginLeft + ClassicHMargin;
            vMargin = 0;
        }
    }

    if (aero) {
        int leftMargin   = 18; // ### hardcoded for now - should be calculated somehow
        int topMargin    = vMargin;
        int rightMargin  = hMargin; // ### for now
        int bottomMargin = vMargin;
        pageFrame->setContentsMargins(leftMargin, topMargin, rightMargin, bottomMargin);
    } else {
        pageFrame->setContentsMargins(hMargin, vMargin, hMargin, vMargin);
    }

    if ((info.watermark || info.sideWidget) && !watermarkLabel) {
        watermarkLabel = new QWatermarkLabel(antiFlickerWidget, sideWidget);
        watermarkLabel->setBackgroundRole(QPalette::Base);
        watermarkLabel->setMinimumHeight(1);
        watermarkLabel->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Expanding);
        watermarkLabel->setAlignment(Qt::AlignLeft | Qt::AlignTop);
    }

    //bool wasSemiTransparent = pageFrame->testAttribute(Qt::WA_SetPalette);
    const bool wasSemiTransparent =
        pageFrame->palette().brush(QPalette::Window).color().alpha() < 255
        || pageFrame->palette().brush(QPalette::Base).color().alpha() < 255;
    if (mac) {
        pageFrame->setAutoFillBackground(true);
        antiFlickerWidget->setAutoFillBackground(false);
    } else {
        if (wasSemiTransparent)
            pageFrame->setPalette(QPalette());

        bool baseBackground = (modern && !info.header); // ### TAG1
        pageFrame->setBackgroundRole(baseBackground ? QPalette::Base : QPalette::Window);

        if (titleLabel)
            titleLabel->setAutoFillBackground(baseBackground);
        pageFrame->setAutoFillBackground(baseBackground);
        if (watermarkLabel)
            watermarkLabel->setAutoFillBackground(baseBackground);
        if (placeholderWidget1)
            placeholderWidget1->setAutoFillBackground(baseBackground);
        if (placeholderWidget2)
            placeholderWidget2->setAutoFillBackground(baseBackground);

        if (aero) {
            QPalette pal = pageFrame->palette();
            pal.setBrush(QPalette::Window, QColor(255, 255, 255));
            pageFrame->setPalette(pal);
            pageFrame->setAutoFillBackground(true);
            pal = antiFlickerWidget->palette();
            pal.setBrush(QPalette::Window, QColor(255, 255, 255));
            antiFlickerWidget->setPalette(pal);
            antiFlickerWidget->setAutoFillBackground(true);
        }
    }

    mainLayout->addWidget(pageFrame, row++, pageColumn);

    int watermarkEndRow = row;
    if (classic)
        mainLayout->setRowMinimumHeight(row++, deltaVSpacing);

    if (aero) {
        buttonLayout->setContentsMargins(9, 9, 9, 9);
        mainLayout->setContentsMargins(0, 11, 0, 0);
    }

    int buttonStartColumn = info.extension ? 1 : 0;
    int buttonNumColumns = info.extension ? 1 : numColumns;

    if (classic || modern) {
        if (!bottomRuler)
            bottomRuler = new QWizardRuler(antiFlickerWidget);
        mainLayout->addWidget(bottomRuler, row++, buttonStartColumn, 1, buttonNumColumns);
    }

    if (classic)
        mainLayout->setRowMinimumHeight(row++, deltaVSpacing);

    mainLayout->addLayout(buttonLayout, row++, buttonStartColumn, 1, buttonNumColumns);

    if (info.watermark || info.sideWidget) {
        if (info.extension)
            watermarkEndRow = row;
        mainLayout->addWidget(watermarkLabel, watermarkStartRow, 0,
                              watermarkEndRow - watermarkStartRow, 1);
    }

    mainLayout->setColumnMinimumWidth(0, mac && !info.watermark ? 181 : 0);
    if (mac)
        mainLayout->setColumnMinimumWidth(2, 21);

    if (headerWidget)
        headerWidget->setVisible(info.header);
    if (titleLabel)
        titleLabel->setVisible(info.title);
    if (subTitleLabel)
        subTitleLabel->setVisible(info.subTitle);
    if (bottomRuler)
        bottomRuler->setVisible(classic || modern);
    if (watermarkLabel)
        watermarkLabel->setVisible(info.watermark || info.sideWidget);

    layoutInfo = info;
}